

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O0

double Place_Turn(int dep,GameBoard *gameBoard,int pl_col,int this_bl_type,int *finalX,int *finalY,
                 int *finalO,int *blockFE)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Tetris te;
  Board __args;
  undefined8 uVar4;
  undefined4 uVar5;
  size_type sVar6;
  ulong uVar7;
  reference pvVar8;
  int *piVar9;
  reference pPVar10;
  reference pvVar11;
  reference pvVar12;
  time_t tVar13;
  reference pvVar14;
  long lVar15;
  int in_EDX;
  int *in_RSI;
  undefined8 *puVar16;
  int in_EDI;
  undefined8 *puVar17;
  int *in_R8;
  int *in_R9;
  byte bVar18;
  pair<std::_Rb_tree_const_iterator<Plan>,_bool> pVar19;
  int *in_stack_00000008;
  value_type *in_stack_00000010;
  int ind;
  int ch2;
  int ch1;
  double sum;
  double rd;
  double p2 [45];
  double p1 [45];
  int zt;
  Slash_Simplex as;
  Standard_Simplex ss;
  double inh_1;
  double val;
  int ind_1;
  iterator it;
  int this_ht;
  int this_ele;
  double now_val;
  double inh;
  Block now_bl;
  Board myBoard2;
  Board myBoard;
  GameBoard nowBoard;
  set<Plan,_std::less<Plan>,_std::allocator<Plan>_> s;
  vector<int,_std::allocator<int>_> index;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  int m;
  int n;
  int j;
  int i;
  vector<Tetris,_std::allocator<Tetris>_> loc;
  GameBoard *in_stack_fffffffffffe2ca8;
  undefined4 in_stack_fffffffffffe2cb0;
  int in_stack_fffffffffffe2cb4;
  undefined4 in_stack_fffffffffffe2cb8;
  int in_stack_fffffffffffe2cbc;
  undefined7 in_stack_fffffffffffe2cc0;
  undefined1 in_stack_fffffffffffe2cc7;
  undefined4 in_stack_fffffffffffe2cc8;
  int in_stack_fffffffffffe2ccc;
  Board *in_stack_fffffffffffe2cd0;
  undefined1 in_stack_fffffffffffe2ce0 [32];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffe2d00;
  undefined4 in_stack_fffffffffffe2d08;
  int in_stack_fffffffffffe2d0c;
  GameBoard *in_stack_fffffffffffe2d10;
  undefined4 in_stack_fffffffffffe2d18;
  int in_stack_fffffffffffe2d1c;
  GameBoard *in_stack_fffffffffffe2d20;
  undefined8 in_stack_fffffffffffe2d28;
  undefined8 in_stack_fffffffffffe2d30;
  undefined4 in_stack_fffffffffffe2d38;
  undefined4 in_stack_fffffffffffe2d3c;
  undefined8 in_stack_fffffffffffe2d40;
  double dVar20;
  undefined8 in_stack_fffffffffffe2d48;
  double dVar21;
  undefined8 in_stack_fffffffffffe2d50;
  undefined8 in_stack_fffffffffffe2d58;
  undefined4 in_stack_fffffffffffe2d60;
  int in_stack_fffffffffffe2d64;
  vector<Tetris,_std::allocator<Tetris>_> *this;
  GameBoard *__dest;
  undefined4 in_stack_fffffffffffe2d78;
  undefined4 in_stack_fffffffffffe2d8c;
  undefined1 unique;
  vector<Tetris,_std::allocator<Tetris>_> *in_stack_fffffffffffe2d90;
  int in_stack_fffffffffffe2d98;
  int in_stack_fffffffffffe2d9c;
  GameBoard *in_stack_fffffffffffe2da0;
  int iStack_1d210;
  int iStack_1d20c;
  ulong auStack_1d1f8 [46];
  undefined8 auStack_1d088 [5];
  int in_stack_fffffffffffe2fa0;
  int in_stack_fffffffffffe2fa4;
  GameBoard *in_stack_fffffffffffe2fa8;
  undefined8 auStack_1cf08 [105];
  ulong auStack_1cbc0 [11131];
  byte abStack_6fe8 [112];
  double local_6f78;
  int local_6f70;
  int local_6f6c;
  undefined8 auStack_6f68 [55];
  undefined8 auStack_6db0 [55];
  value_type avStack_6bf8 [3025];
  _Base_ptr local_d70;
  double local_d68;
  double local_d60;
  _Base_ptr local_d58;
  int local_d50;
  int local_d4c;
  _Base_ptr local_d48;
  int local_d24;
  int local_d20;
  int local_d1c;
  _Base_ptr local_d18;
  _Base_ptr local_d10;
  undefined1 local_d08;
  Plan local_d00;
  int local_ce8;
  undefined8 local_ce0 [17];
  double local_c58;
  double local_c50;
  GameBoard *local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  int (*paiStack_c30) [8];
  undefined8 local_c28;
  Block local_c18 [9];
  undefined1 local_b80 [136];
  undefined4 local_af8;
  GameBoard local_af4;
  vector<int,_std::allocator<int>_> local_a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_80;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  vector<Tetris,_std::allocator<Tetris>_> local_48;
  int *local_30;
  int *local_28;
  int local_1c;
  int *local_18;
  int local_c;
  double local_8;
  
  unique = (undefined1)((uint)in_stack_fffffffffffe2d8c >> 0x18);
  bVar18 = 0;
  if (in_EDI == 5) {
    local_8 = naive_place(in_stack_fffffffffffe2fa8,in_stack_fffffffffffe2fa4,
                          in_stack_fffffffffffe2fa0);
  }
  else {
    local_30 = in_R9;
    local_28 = in_R8;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_c = in_EDI;
    std::vector<Tetris,_std::allocator<Tetris>_>::vector
              ((vector<Tetris,_std::allocator<Tetris>_> *)0x1436f3);
    GameBoard::getPlaces
              (in_stack_fffffffffffe2da0,in_stack_fffffffffffe2d9c,in_stack_fffffffffffe2d98,
               in_stack_fffffffffffe2d90,(bool)unique);
    std::vector<Tetris,_std::allocator<Tetris>_>::size(&local_48);
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x143748);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffe2cd0,
             CONCAT44(in_stack_fffffffffffe2ccc,in_stack_fffffffffffe2cc8),
             (allocator_type *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0));
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x143774);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x143781);
    std::set<Plan,_std::less<Plan>,_std::allocator<Plan>_>::set
              ((set<Plan,_std::less<Plan>,_std::allocator<Plan>_> *)0x14378e);
    GameBoard::GameBoard(in_stack_fffffffffffe2d20);
    sVar6 = std::vector<Tetris,_std::allocator<Tetris>_>::size(&local_48);
    if (sVar6 == 0) {
      local_8 = -100000.0;
    }
    else {
      for (local_58 = 0; uVar7 = (ulong)local_58,
          sVar6 = std::vector<Tetris,_std::allocator<Tetris>_>::size(&local_48), uVar7 < sVar6;
          local_58 = local_58 + 1) {
        global_i = local_58;
        Board::Board((Board *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0),
                     in_stack_fffffffffffe2cbc,
                     (GameBoard *)CONCAT44(in_stack_fffffffffffe2cb4,in_stack_fffffffffffe2cb0));
        Board::Board((Board *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0),
                     in_stack_fffffffffffe2cbc,
                     (GameBoard *)CONCAT44(in_stack_fffffffffffe2cb4,in_stack_fffffffffffe2cb0));
        pvVar8 = std::vector<Tetris,_std::allocator<Tetris>_>::operator[](&local_48,(long)local_58);
        local_c28 = *(undefined8 *)&pvVar8->color;
        in_stack_fffffffffffe2ca8 = pvVar8->gameBoard;
        uVar2._0_4_ = pvVar8->blockType;
        uVar2._4_4_ = pvVar8->blockX;
        uVar4 = pvVar8->gameBoard;
        uVar5 = pvVar8->blockType;
        te.blockType = uVar5;
        te.gameBoard = (GameBoard *)uVar4;
        uVar3._0_4_ = pvVar8->blockY;
        uVar3._4_4_ = pvVar8->orientation;
        paiStack_c30 = pvVar8->shape;
        in_stack_fffffffffffe2cc8 = (undefined4)local_c28;
        in_stack_fffffffffffe2ccc = (int)((ulong)local_c28 >> 0x20);
        in_stack_fffffffffffe2cc0 = SUB87(paiStack_c30,0);
        in_stack_fffffffffffe2cc7 = (undefined1)((ulong)paiStack_c30 >> 0x38);
        te.blockX = uVar2._4_4_;
        te.blockY = (undefined4)uVar3;
        te.orientation = uVar3._4_4_;
        te.shape._0_7_ = in_stack_fffffffffffe2cc0;
        te.shape._7_1_ = in_stack_fffffffffffe2cc7;
        te.color = in_stack_fffffffffffe2cc8;
        te._36_4_ = in_stack_fffffffffffe2ccc;
        local_c48 = in_stack_fffffffffffe2ca8;
        uStack_c40 = uVar2;
        local_c38 = uVar3;
        Block::Block(local_c18,te);
        memcpy(local_ce0,local_b80,0x88);
        puVar16 = local_ce0;
        puVar17 = (undefined8 *)&stack0xfffffffffffe2ca8;
        in_stack_fffffffffffe2cb0 = (undefined4)uVar2;
        in_stack_fffffffffffe2cb4 = uVar2._4_4_;
        in_stack_fffffffffffe2cb8 = (undefined4)uVar3;
        in_stack_fffffffffffe2cbc = uVar3._4_4_;
        for (lVar15 = 0x11; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar17 = *puVar16;
          puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
        }
        __args.rows._32_8_ = in_stack_fffffffffffe2d00;
        __args.rows[0] = in_stack_fffffffffffe2ce0._0_4_;
        __args.rows[1] = in_stack_fffffffffffe2ce0._4_4_;
        __args.rows[2] = in_stack_fffffffffffe2ce0._8_4_;
        __args.rows[3] = in_stack_fffffffffffe2ce0._12_4_;
        __args.rows[4] = in_stack_fffffffffffe2ce0._16_4_;
        __args.rows[5] = in_stack_fffffffffffe2ce0._20_4_;
        __args.rows[6] = in_stack_fffffffffffe2ce0._24_4_;
        __args.rows[7] = in_stack_fffffffffffe2ce0._28_4_;
        __args.rows[10] = in_stack_fffffffffffe2d08;
        __args.rows[0xb] = in_stack_fffffffffffe2d0c;
        __args.rows._48_8_ = in_stack_fffffffffffe2d10;
        __args.rows[0xe] = in_stack_fffffffffffe2d18;
        __args.rows[0xf] = in_stack_fffffffffffe2d1c;
        __args.rows._64_8_ = in_stack_fffffffffffe2d20;
        __args.rows[0x12] = (int)in_stack_fffffffffffe2d28;
        __args.rows[0x13] = (int)((ulong)in_stack_fffffffffffe2d28 >> 0x20);
        __args.rows[0x14] = (int)in_stack_fffffffffffe2d30;
        __args.rows[0x15] = (int)((ulong)in_stack_fffffffffffe2d30 >> 0x20);
        __args.cols[0] = in_stack_fffffffffffe2d38;
        __args.cols[1] = in_stack_fffffffffffe2d3c;
        __args.cols[2] = (int)in_stack_fffffffffffe2d40;
        __args.cols[3] = (int)((ulong)in_stack_fffffffffffe2d40 >> 0x20);
        __args.cols[4] = (int)in_stack_fffffffffffe2d48;
        __args.cols[5] = (int)((ulong)in_stack_fffffffffffe2d48 >> 0x20);
        __args.cols[6] = (int)in_stack_fffffffffffe2d50;
        __args.cols[7] = (int)((ulong)in_stack_fffffffffffe2d50 >> 0x20);
        __args.cols[8] = (int)in_stack_fffffffffffe2d58;
        __args.cols[9] = (int)((ulong)in_stack_fffffffffffe2d58 >> 0x20);
        __args.cols[10] = in_stack_fffffffffffe2d60;
        __args.cols[0xb] = in_stack_fffffffffffe2d64;
        local_c58 = std::function<double_(Board,_const_Block_&,_double_&,_bool)>::operator()
                              ((function<double_(Board,_const_Block_&,_double_&,_bool)> *)
                               in_stack_fffffffffffe2cd0,__args,
                               (Block *)CONCAT44(in_stack_fffffffffffe2ccc,in_stack_fffffffffffe2cc8
                                                ),
                               (double *)
                               CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0),
                               SUB41((uint)in_stack_fffffffffffe2cbc >> 0x18,0));
        eval(in_stack_fffffffffffe2cd0,
             (Block *)CONCAT44(in_stack_fffffffffffe2ccc,in_stack_fffffffffffe2cc8),
             (int *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0),
             (int *)CONCAT44(in_stack_fffffffffffe2cbc,in_stack_fffffffffffe2cb8));
        if (local_c == 1) {
          if (local_1c == *local_18) {
            if (0x14 < local_ce8 + enemyele) {
              local_c58 = local_c58 - 100.0;
            }
            if (0x14 < myele + enemyht) {
              local_c58 = local_c58 + 10000.0;
            }
          }
          else if (0x14 < myele + local_ce8) {
            local_c58 = local_c58 - 100.0;
          }
        }
        Plan::Plan(&local_d00,local_c58,local_c50,local_58);
        pVar19 = std::set<Plan,_std::less<Plan>,_std::allocator<Plan>_>::insert
                           ((set<Plan,_std::less<Plan>,_std::allocator<Plan>_> *)
                            in_stack_fffffffffffe2cd0,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffe2ccc,in_stack_fffffffffffe2cc8));
        local_d10 = (_Base_ptr)pVar19.first._M_node;
        local_d08 = pVar19.second;
      }
      local_d18 = (_Base_ptr)
                  std::set<Plan,_std::less<Plan>,_std::allocator<Plan>_>::begin
                            ((set<Plan,_std::less<Plan>,_std::allocator<Plan>_> *)
                             in_stack_fffffffffffe2ca8);
      local_58 = 0;
      while( true ) {
        uVar2._4_4_ = local_58;
        sVar6 = std::vector<Tetris,_std::allocator<Tetris>_>::size(&local_48);
        local_d1c = (int)sVar6;
        local_d20 = 10;
        piVar9 = std::min<int>(&local_d1c,&local_d20);
        if (*piVar9 <= uVar2._4_4_) break;
        pPVar10 = std::_Rb_tree_const_iterator<Plan>::operator*
                            ((_Rb_tree_const_iterator<Plan> *)0x143ba1);
        local_d24 = pPVar10->idx;
        __dest = &local_af4;
        memcpy(__dest,local_18,0xa24);
        this = &local_48;
        uVar2._4_4_ = local_1c;
        std::vector<Tetris,_std::allocator<Tetris>_>::operator[](this,(long)local_d24);
        std::vector<Tetris,_std::allocator<Tetris>_>::operator[](this,(long)local_d24);
        std::vector<Tetris,_std::allocator<Tetris>_>::operator[](this,(long)local_d24);
        GameBoard::place((GameBoard *)CONCAT44(uVar2._4_4_,in_stack_fffffffffffe2d78),
                         (int)((ulong)__dest >> 0x20),(int)__dest,(int)((ulong)this >> 0x20),
                         (int)this,in_stack_fffffffffffe2d64);
        GameBoard::eliminate(&local_af4,local_1c);
        in_stack_fffffffffffe2d64 = local_1c;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&local_80,(long)local_58);
        Jam_Turn(in_stack_fffffffffffe2d1c,in_stack_fffffffffffe2d10,in_stack_fffffffffffe2d0c,
                 in_stack_fffffffffffe2d00);
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0),
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffe2cbc,in_stack_fffffffffffe2cb8));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0));
        local_58 = local_58 + 1;
        local_d48 = (_Base_ptr)
                    std::_Rb_tree_const_iterator<Plan>::operator++
                              ((_Rb_tree_const_iterator<Plan> *)
                               CONCAT44(in_stack_fffffffffffe2cbc,in_stack_fffffffffffe2cb8),
                               in_stack_fffffffffffe2cb4);
      }
      sVar6 = std::vector<Tetris,_std::allocator<Tetris>_>::size(&local_48);
      local_d4c = (int)sVar6;
      local_d50 = 10;
      piVar9 = std::min<int>(&local_d4c,&local_d50);
      local_60 = *piVar9;
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&local_80,0);
      sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
      local_64 = (int)sVar6;
      local_d58 = (_Base_ptr)
                  std::set<Plan,_std::less<Plan>,_std::allocator<Plan>_>::begin
                            ((set<Plan,_std::less<Plan>,_std::allocator<Plan>_> *)
                             in_stack_fffffffffffe2ca8);
      local_58 = 0;
      local_d18 = local_d58;
      while (local_58 < local_60) {
        pPVar10 = std::_Rb_tree_const_iterator<Plan>::operator*
                            ((_Rb_tree_const_iterator<Plan> *)0x143df4);
        local_d60 = pPVar10->eva;
        pPVar10 = std::_Rb_tree_const_iterator<Plan>::operator*
                            ((_Rb_tree_const_iterator<Plan> *)0x143e0e);
        local_d68 = pPVar10->inh;
        for (local_5c = 0; local_5c < local_64; local_5c = local_5c + 1) {
          dVar21 = F_ROUND_WIGHT[local_c];
          dVar20 = local_d60;
          pvVar11 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&local_80,(long)local_58);
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)local_5c)
          ;
          *pvVar12 = dVar20 * dVar21 + *pvVar12;
          dVar21 = local_d68;
          pvVar11 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&local_80,(long)local_58);
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)local_5c)
          ;
          *pvVar12 = dVar21 + *pvVar12;
        }
        local_58 = local_58 + 1;
        local_d70 = (_Base_ptr)
                    std::_Rb_tree_const_iterator<Plan>::operator++
                              ((_Rb_tree_const_iterator<Plan> *)
                               CONCAT44(in_stack_fffffffffffe2cbc,in_stack_fffffffffffe2cb8),
                               in_stack_fffffffffffe2cb4);
      }
      Standard_Simplex::Standard_Simplex
                ((Standard_Simplex *)CONCAT44(in_stack_fffffffffffe2cb4,in_stack_fffffffffffe2cb0));
      local_6f70 = local_60 + 2;
      local_6f6c = local_64 + 2;
      auStack_6db0[local_60 + 1] = 0x3ff0000000000000;
      auStack_6db0[local_60 + 2] = 0xbff0000000000000;
      for (local_58 = 1; local_58 <= local_64; local_58 = local_58 + 1) {
        auStack_6f68[local_58] = 0;
        for (local_5c = 1; local_5c <= local_60; local_5c = local_5c + 1) {
          pvVar11 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&local_80,(long)(local_5c + -1));
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar11,(long)(local_58 + -1));
          avStack_6bf8[(long)local_58 * 0x37 + (long)local_5c] = -*pvVar12;
        }
        avStack_6bf8[(long)local_58 * 0x37 + (long)(local_60 + 1)] = 1.0;
        avStack_6bf8[(long)local_58 * 0x37 + (long)(local_60 + 2)] = -1.0;
      }
      auStack_6f68[local_64 + 1] = 0x3ff0000000000000;
      for (local_5c = 1; local_5c <= local_60; local_5c = local_5c + 1) {
        avStack_6bf8[(long)(local_64 + 1) * 0x37 + (long)local_5c] = 1.0;
      }
      auStack_6f68[local_64 + 2] = 0xbff0000000000000;
      for (local_5c = 1; local_5c <= local_60; local_5c = local_5c + 1) {
        avStack_6bf8[(long)(local_64 + 2) * 0x37 + (long)local_5c] = -1.0;
      }
      Slash_Simplex::Slash_Simplex
                ((Slash_Simplex *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0),
                 (Standard_Simplex *)CONCAT44(in_stack_fffffffffffe2cbc,in_stack_fffffffffffe2cb8));
      Slash_Simplex::simplex
                ((Slash_Simplex *)CONCAT44(in_stack_fffffffffffe2ccc,in_stack_fffffffffffe2cc8),
                 (bool)in_stack_fffffffffffe2cc7);
      if (local_c == 1) {
        uVar2._4_4_ = local_18[4];
        tVar13 = time((time_t *)0x0);
        srand(uVar2._4_4_ * (int)tVar13);
        for (local_58 = 1; local_58 <= local_60; local_58 = local_58 + 1) {
          if ((abStack_6fe8[local_58] & 1) == 0) {
            auStack_1d088[local_58] = 0;
          }
          else {
            auStack_1d088[local_58] = auStack_1cf08[local_58];
          }
        }
        for (local_58 = 1; local_58 <= local_64; local_58 = local_58 + 1) {
          if ((abStack_6fe8[local_58 + local_60 + 2] & 1) == 0) {
            auStack_1d1f8[local_58] = auStack_1cbc0[local_58 + local_60 + 2] ^ 0x8000000000000000;
          }
          else {
            auStack_1d1f8[local_58] = 0;
          }
        }
        get_CH((double *)in_stack_fffffffffffe2cd0,in_stack_fffffffffffe2ccc,
               (int *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0));
        local_d18 = (_Base_ptr)
                    std::set<Plan,_std::less<Plan>,_std::allocator<Plan>_>::begin
                              ((set<Plan,_std::less<Plan>,_std::allocator<Plan>_> *)
                               in_stack_fffffffffffe2ca8);
        local_58 = 0;
        while (local_58 < iStack_1d20c) {
          local_58 = local_58 + 1;
          std::_Rb_tree_const_iterator<Plan>::operator++
                    ((_Rb_tree_const_iterator<Plan> *)
                     CONCAT44(in_stack_fffffffffffe2cbc,in_stack_fffffffffffe2cb8),
                     in_stack_fffffffffffe2cb4);
        }
        pPVar10 = std::_Rb_tree_const_iterator<Plan>::operator*
                            ((_Rb_tree_const_iterator<Plan> *)0x144475);
        uVar2._4_4_ = pPVar10->idx;
        pvVar8 = std::vector<Tetris,_std::allocator<Tetris>_>::operator[]
                           (&local_48,(long)uVar2._4_4_);
        *local_28 = pvVar8->blockX;
        pvVar8 = std::vector<Tetris,_std::allocator<Tetris>_>::operator[]
                           (&local_48,(long)uVar2._4_4_);
        *local_30 = pvVar8->blockY;
        pvVar8 = std::vector<Tetris,_std::allocator<Tetris>_>::operator[]
                           (&local_48,(long)uVar2._4_4_);
        *in_stack_00000008 = pvVar8->orientation;
        get_CH((double *)in_stack_fffffffffffe2cd0,in_stack_fffffffffffe2ccc,
               (int *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0));
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)iStack_1d210);
        *in_stack_00000010 = *pvVar14;
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      local_8 = local_6f78;
    }
    local_af8 = 1;
    std::set<Plan,_std::less<Plan>,_std::allocator<Plan>_>::~set
              ((set<Plan,_std::less<Plan>,_std::allocator<Plan>_> *)0x144531);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0));
    std::vector<Tetris,_std::allocator<Tetris>_>::~vector
              ((vector<Tetris,_std::allocator<Tetris>_> *)
               CONCAT17(in_stack_fffffffffffe2cc7,in_stack_fffffffffffe2cc0));
  }
  return local_8;
}

Assistant:

double Place_Turn(int dep, GameBoard& gameBoard, int pl_col, int this_bl_type, int &finalX = nouse, int &finalY = nouse, int &finalO = nouse, int &blockFE = nouse) //floc 表示最终选的块的位置,blockFE表示给敌人的块
{
    if (dep == (gameBoard.turnID < 10 ? DEPTH_LIM_2 : DEPTH_LIM_1)) //最后一层直接贪
        return naive_place(gameBoard, pl_col, this_bl_type);
    //debug(dep);
    std::vector<Tetris> loc;
    gameBoard.getPlaces(pl_col, this_bl_type, loc);
    int i, j, n, m;
    vector<vector<double> > A(loc.size());
    vector<int> index;
    set<Plan> s;
    GameBoard nowBoard;
    if(loc.size() == 0)
        return -1e5;
    for (i = 0; i < loc.size(); i++)
    {
        global_i = i;
        #ifdef DEBUG_DECIDE
        debug(i);
        debug(loc[i].blockX);
        debug(loc[i].blockY);
        debug(loc[i].orientation);
        #endif
        Board myBoard(pl_col, gameBoard), myBoard2(pl_col, gameBoard);
        Block now_bl = Block(loc[i]);
        double inh;
        double now_val = Eval(myBoard, now_bl, inh,0);
        int this_ele, this_ht;
        eval(myBoard2, now_bl, this_ele, this_ht);
        if(dep == 1)
        {
            if(pl_col == gameBoard.currBotColor) //考虑自己的局面
            {
                if(this_ht + enemyele > 20)
                    now_val -= Risk_Value;
                if(myele + enemyht > 20)
                    now_val += MustWin;
            }
            else
            {
                if(myele + this_ht > 20)
                    now_val -= Risk_Value;
            }
        }
        
        s.insert(Plan(now_val, inh, i));
    }
        //debug(now_val);
    set<Plan>::iterator it=s.begin();
    for (i = 0; i < min((int)loc.size(), MAX_SEARCH); i++, it++)    
    {
        int ind = (*it).idx;
        //debug(ind);
        #ifdef DEBUG_DECIDE
        debug(loc[ind].blockX);
        debug(loc[ind].blockY);
        debug(loc[ind].orientation);
        debug((*it).eva);
        #endif
        nowBoard = gameBoard;
        nowBoard.place(pl_col, this_bl_type, loc[ind].blockX, loc[ind].blockY, loc[ind].orientation);
        nowBoard.eliminate(pl_col);
        index = Jam_Turn(dep + 1, nowBoard, pl_col, A[i]);
    }
    n = min((int)loc.size(), MAX_SEARCH);
    m = A[0].size();

    //debug(n);
    //debug(m);
    for(it = s.begin(), i = 0; i < n; i++, it++)
    {
        double val = (*it).eva;
        double inh = (*it).inh;
        for (j = 0; j < m; j++)
        {
            #ifdef DEBUG_DECIDE
            cerr << A[i][j] << " ";
            #endif
            A[i][j] += val * F_ROUND_WIGHT[dep];
            A[i][j] += inh;
        }
        #ifdef DEBUG_DECIDE
        cerr << endl;
        #endif
    }
    Standard_Simplex ss;
    ss.n = n + 2, ss.m = m + 2;
    ss.c[n+1] = 1;
    ss.c[n+2] = -1;
    for(i = 1; i <= m; i++)
    {
        ss.b[i] = 0;
        for(j = 1; j <= n; j++)
            ss.a[i][j] = -A[j-1][i-1]; //注意下标要-1
        ss.a[i][n+1] = 1;
        ss.a[i][n+2] = -1;
    }   
    ss.b[m+1] = 1;
    for(j = 1; j <= n; j++)
        ss.a[m+1][j] = 1;
    ss.b[m+2] = -1;
    for(j = 1; j <= n; j++)
        ss.a[m+2][j] = -1;

    Slash_Simplex as(ss);
    //as.Print();
    int zt = as.simplex(0);
    //debug("end*******************************************");
    if(dep != 1) //不是第一层就不用考虑决策的事情
        return as.rel;
    //决策过程
    srand(gameBoard.turnID * time(0));
    double p1[45], p2[45], rd, sum;
    int ch1, ch2;
    for (i = 1; i <= n; i++)
    {
        if(as.basic[i])
            p1[i] = as.b[i];
        else p1[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p1[i] << " ";
        #endif
    }
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    for (i = 1; i <= m; i++) //得到对偶的答案
    {
        if(!as.basic[i+n+2])
            p2[i] = -as.c[i+n+2];
        else p2[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p2[i] << " ";
        #endif
    }

    //debug("get ans");
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    
    get_CH(p1,n,ch1);
    //debug(ch1);
    for (it = s.begin(), i = 0; i < ch1; i++, it++);
    int ind = (*it).idx;
    finalX = loc[ind].blockX;
    finalY = loc[ind].blockY;
    finalO = loc[ind].orientation;
    //debug(ch1);
    //debug("get loc");

    get_CH(p2,m,ch2);

    /*sum = 0;
    max_p = 0;
    rd = (double)(rand()%10000) / 10000.0;
    for (i = 1; i <= m; i++)
        if(p2[i] >= max_p)
        {
            ch2 = i - 1;
            max_p = p2[i];
            //break;
        }
        //else sum += p2[i];
    */
    blockFE = index[ch2];
}